

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O0

int pkcs12_parse_pbe_params(mbedtls_asn1_buf *params,mbedtls_asn1_buf *salt,int *iterations)

{
  int iVar1;
  uchar **p_00;
  uchar *end_00;
  uchar *end;
  uchar **p;
  int ret;
  int *iterations_local;
  mbedtls_asn1_buf *salt_local;
  mbedtls_asn1_buf *params_local;
  
  p_00 = &params->p;
  end_00 = params->p + params->len;
  if (params->tag == 0x30) {
    iVar1 = mbedtls_asn1_get_tag(p_00,end_00,&salt->len,4);
    if (iVar1 == 0) {
      salt->p = *p_00;
      *p_00 = *p_00 + salt->len;
      iVar1 = mbedtls_asn1_get_int(p_00,end_00,iterations);
      if (iVar1 == 0) {
        if (*p_00 == end_00) {
          params_local._4_4_ = 0;
        }
        else {
          params_local._4_4_ = -0x1ee6;
        }
      }
      else {
        params_local._4_4_ = iVar1 + -0x1e80;
      }
    }
    else {
      params_local._4_4_ = iVar1 + -0x1e80;
    }
  }
  else {
    params_local._4_4_ = -0x1ee2;
  }
  return params_local._4_4_;
}

Assistant:

static int pkcs12_parse_pbe_params( mbedtls_asn1_buf *params,
                                    mbedtls_asn1_buf *salt, int *iterations )
{
    int ret;
    unsigned char **p = &params->p;
    const unsigned char *end = params->p + params->len;

    /*
     *  pkcs-12PbeParams ::= SEQUENCE {
     *    salt          OCTET STRING,
     *    iterations    INTEGER
     *  }
     *
     */
    if( params->tag != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
        return( MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    if( ( ret = mbedtls_asn1_get_tag( p, end, &salt->len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT + ret );

    salt->p = *p;
    *p += salt->len;

    if( ( ret = mbedtls_asn1_get_int( p, end, iterations ) ) != 0 )
        return( MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT + ret );

    if( *p != end )
        return( MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}